

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O1

void libxml_xmlTextReaderErrorCallback
               (void *arg,char *msg,int severity,xmlTextReaderLocatorPtr locator)

{
  long *plVar1;
  PyObject *pPVar2;
  long *plVar3;
  
  plVar1 = (long *)PyTuple_New(4);
  PyTuple_SetItem(plVar1,0,*(undefined8 *)((long)arg + 8));
  plVar3 = *(long **)((long)arg + 8);
  if (plVar3 != (long *)0x0) {
    *plVar3 = *plVar3 + 1;
  }
  pPVar2 = libxml_charPtrConstWrap(msg);
  PyTuple_SetItem(plVar1,1,pPVar2);
  pPVar2 = libxml_intWrap(severity);
  PyTuple_SetItem(plVar1,2,pPVar2);
  pPVar2 = libxml_xmlTextReaderLocatorPtrWrap(locator);
  PyTuple_SetItem(plVar1,3,pPVar2);
  plVar3 = (long *)PyObject_CallObject(*arg,plVar1);
  if (plVar3 == (long *)0x0) {
    PyErr_Print();
  }
  if ((plVar1 != (long *)0x0) && (*plVar1 = *plVar1 + -1, *plVar1 == 0)) {
    _Py_Dealloc(plVar1);
  }
  if ((plVar3 != (long *)0x0) && (*plVar3 = *plVar3 + -1, *plVar3 == 0)) {
    _Py_Dealloc(plVar3);
    return;
  }
  return;
}

Assistant:

static void 
libxml_xmlTextReaderErrorCallback(void *arg, 
				  const char *msg,
				  int severity,
				  xmlTextReaderLocatorPtr locator)
{
    xmlTextReaderPyCtxt *pyCtxt = (xmlTextReaderPyCtxt *)arg;
    PyObject *list;
    PyObject *result;
    
    list = PyTuple_New(4);
    PyTuple_SetItem(list, 0, pyCtxt->arg);
    Py_XINCREF(pyCtxt->arg);
    PyTuple_SetItem(list, 1, libxml_charPtrConstWrap(msg));
    PyTuple_SetItem(list, 2, libxml_intWrap(severity));
    PyTuple_SetItem(list, 3, libxml_xmlTextReaderLocatorPtrWrap(locator));
    result = PyObject_CallObject(pyCtxt->f, list);
    if (result == NULL)
    {
	/* TODO: manage for the exception to be propagated... */
	PyErr_Print();
    }
    Py_XDECREF(list);
    Py_XDECREF(result);
}